

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::WriteNode
          (cmGraphVizWriter *this,string *targetName,cmTarget *target,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *insertedNodes,cmGeneratedFileStream *str)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  char *pcVar4;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  const_iterator nameIt;
  _Self local_40;
  _Self local_38;
  cmGeneratedFileStream *local_30;
  cmGeneratedFileStream *str_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *insertedNodes_local;
  cmTarget *target_local;
  string *targetName_local;
  cmGraphVizWriter *this_local;
  
  local_30 = str;
  str_local = (cmGeneratedFileStream *)insertedNodes;
  insertedNodes_local =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)target;
  target_local = (cmTarget *)targetName;
  targetName_local = &this->GraphType;
  local_38._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(insertedNodes,targetName);
  local_40._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)str_local);
  bVar1 = std::operator==(&local_38,&local_40);
  if (bVar1) {
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)str_local,(value_type *)target_local);
    nameIt._M_node = (_Base_ptr)pVar5.first._M_node;
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->TargetNamesNodes,(key_type *)target_local);
    poVar2 = std::operator<<((ostream *)local_30,"    \"");
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_58);
    poVar2 = std::operator<<(poVar2,(string *)&ppVar3->second);
    poVar2 = std::operator<<(poVar2,"\" [ label=\"");
    poVar2 = std::operator<<(poVar2,(string *)target_local);
    poVar2 = std::operator<<(poVar2,"\" shape=\"");
    pcVar4 = getShapeForTarget((cmTarget *)insertedNodes_local);
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2,"\"];");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void cmGraphVizWriter::WriteNode(const std::string& targetName,
                                 const cmTarget* target,
                                 std::set<std::string>& insertedNodes,
                                 cmGeneratedFileStream& str) const
{
  if (insertedNodes.find(targetName) == insertedNodes.end())
  {
    insertedNodes.insert(targetName);
    std::map<std::string, std::string>::const_iterator nameIt =
                                       this->TargetNamesNodes.find(targetName);

    str << "    \"" << nameIt->second << "\" [ label=\""
        << targetName <<  "\" shape=\"" << getShapeForTarget(target)
        << "\"];" << std::endl;
  }
}